

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O0

QVariant * convertToInt(QVariant *__return_storage_ptr__,QString *str)

{
  char *pcVar1;
  longlong lVar2;
  QByteArray local_68;
  QByteArray local_40;
  longlong local_28;
  longlong i;
  char *end;
  QString *str_local;
  
  end = (char *)str;
  str_local = (QString *)__return_storage_ptr__;
  QString::toLocal8Bit(&local_40,str);
  pcVar1 = QByteArray::constData(&local_40);
  lVar2 = strtoll(pcVar1,(char **)&i,10);
  QByteArray::~QByteArray(&local_40);
  local_28 = lVar2;
  if (*(char *)i == '\0') {
    QVariant::QVariant(__return_storage_ptr__,lVar2);
  }
  else {
    QString::toLocal8Bit(&local_68,(QString *)end);
    pcVar1 = QByteArray::constData(&local_68);
    QVariant::QVariant(__return_storage_ptr__,pcVar1);
    QByteArray::~QByteArray(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

inline QVariant convertToInt(const QString &str) {
    char *end;
    auto i = strtoll(str.toLocal8Bit().constData(), &end, 10); // check if value can be converted to integer

    if (*end == '\0')  {
        return i;
    } else {
        return str.toLocal8Bit().constData();
    }
}